

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall rw::Matrix::optimize(Matrix *this,Tolerance *tolerance)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float32 fVar4;
  bool32 isidentity;
  bool32 isorthogonal;
  bool32 isnormal;
  Tolerance *tolerance_local;
  Matrix *this_local;
  
  _isorthogonal = tolerance;
  if (tolerance == (Tolerance *)0x0) {
    _isorthogonal = (Tolerance *)&matrixDefaultTolerance;
  }
  fVar4 = normalError(this);
  bVar1 = (float)fVar4 <= (float)_isorthogonal->normal;
  fVar4 = orthogonalError(this);
  bVar2 = (float)fVar4 <= (float)_isorthogonal->orthogonal;
  bVar3 = false;
  if ((bVar1) && (bVar3 = false, bVar2)) {
    fVar4 = identityError(this);
    bVar3 = (float)fVar4 <= (float)_isorthogonal->identity;
  }
  if (bVar1) {
    this->flags = this->flags | 1;
  }
  else {
    this->flags = this->flags & 0xfffffffe;
  }
  if (bVar2) {
    this->flags = this->flags | 2;
  }
  else {
    this->flags = this->flags & 0xfffffffd;
  }
  if (bVar3) {
    this->flags = this->flags | 0x20000;
  }
  else {
    this->flags = this->flags & 0xfffdffff;
  }
  return;
}

Assistant:

void
Matrix::optimize(Tolerance *tolerance)
{
	bool32 isnormal, isorthogonal, isidentity;
	if(tolerance == nil)
		tolerance = &matrixDefaultTolerance;
	isnormal = normalError() <= tolerance->normal;
	isorthogonal = orthogonalError() <= tolerance->orthogonal;
	isidentity = isnormal && isorthogonal && identityError() <= tolerance->identity;
	if(isnormal)
		flags |= TYPENORMAL;
	else
		flags &= ~TYPENORMAL;
	if(isorthogonal)
		flags |= TYPEORTHOGONAL;
	else
		flags &= ~TYPEORTHOGONAL;
	if(isidentity)
		flags |= IDENTITY;
	else
		flags &= ~IDENTITY;
}